

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collide.cpp
# Opt level: O0

bool embree::intersect_triangle_triangle(uint geomID0,uint primID0,uint geomID1,uint primID1)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  Vec3fa b2;
  Vec3fa b1;
  Vec3fa b0;
  Vec3fa a2;
  Vec3fa a1;
  Vec3fa a0;
  vint4 t0;
  Triangle *tri1;
  Triangle *tri0;
  pointer mesh1;
  pointer mesh0;
  undefined8 local_428;
  unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
  *in_stack_fffffffffffffbe0;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  Vec3fa *local_398;
  Vec3fa *pVStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  Vec3fa *local_378;
  Vec3fa *pVStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  reference local_358;
  reference local_350;
  pointer local_348;
  pointer local_340;
  uint local_334;
  uint local_330;
  uint local_32c;
  uint local_328;
  int local_320;
  int local_31c;
  int local_318;
  int local_314;
  undefined8 *local_310;
  undefined8 *local_308;
  Vec3fa **local_300;
  Vec3fa **local_2f8;
  undefined8 *local_2f0;
  undefined8 *local_2e8;
  undefined8 *local_2e0;
  undefined8 *local_2d8;
  undefined8 *local_2d0;
  Vec3fa **local_2c8;
  undefined8 *local_2c0;
  undefined8 *local_2b8;
  Vec3fa **local_2b0;
  int local_2a4;
  undefined8 *local_2a0;
  int local_294;
  undefined8 *local_290;
  int local_284;
  undefined8 *local_280;
  reference local_278;
  undefined8 *local_270;
  reference local_268;
  undefined8 *local_260;
  reference local_258;
  undefined8 *local_250;
  reference local_248;
  undefined8 *local_240;
  reference local_238;
  undefined8 *local_230;
  reference local_228;
  undefined1 *local_220;
  undefined8 local_218;
  undefined8 uStack_210;
  int in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  int in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe04;
  Vec3fa *in_stack_fffffffffffffe08;
  Vec3fa *in_stack_fffffffffffffe10;
  Vec3fa *in_stack_fffffffffffffe18;
  Vec3fa *in_stack_fffffffffffffe20;
  int local_178;
  int iStack_174;
  
  if ((in_EDI == in_EDX) && (in_ESI == in_ECX)) {
    return false;
  }
  local_334 = in_ECX;
  local_330 = in_EDX;
  local_32c = in_ESI;
  local_328 = in_EDI;
  std::
  vector<std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>,_std::allocator<std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>_>_>
  ::operator[]((vector<std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>,_std::allocator<std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>_>_>
                *)meshes,(ulong)in_EDI);
  local_340 = std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
              ::get(in_stack_fffffffffffffbe0);
  std::
  vector<std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>,_std::allocator<std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>_>_>
  ::operator[]((vector<std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>,_std::allocator<std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>_>_>
                *)meshes,(ulong)local_330);
  local_348 = std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
              ::get(in_stack_fffffffffffffbe0);
  local_350 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                        (&local_340->tris_,(ulong)local_32c);
  local_358 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                        (&local_348->tris_,(ulong)local_334);
  if (local_328 == local_330) {
    local_314 = local_350->v0;
    local_318 = local_350->v1;
    local_218._0_4_ = local_350->v0;
    local_218._4_4_ = local_350->v1;
    local_320 = local_350->v2;
    local_310 = &local_368;
    uStack_210 = CONCAT44(local_320,local_320);
    local_2a4 = local_358->v0;
    local_2b8 = &local_388;
    local_388 = CONCAT44(local_2a4,local_2a4);
    uStack_380 = CONCAT44(local_2a4,local_2a4);
    local_2b0 = &local_378;
    in_stack_fffffffffffffe08 =
         (Vec3fa *)
         CONCAT44(-(uint)(local_2a4 == local_218._4_4_),-(uint)(local_2a4 == (undefined4)local_218))
    ;
    in_stack_fffffffffffffe10 =
         (Vec3fa *)CONCAT44(-(uint)(local_2a4 == local_320),-(uint)(local_2a4 == local_320));
    local_2f8 = &local_378;
    auVar3._8_8_ = in_stack_fffffffffffffe10;
    auVar3._0_8_ = in_stack_fffffffffffffe08;
    iVar5 = movmskps((int)local_2f8,auVar3);
    if (iVar5 != 0) {
      return false;
    }
    local_294 = local_358->v1;
    local_2d0 = &local_3a8;
    local_3a8 = CONCAT44(local_294,local_294);
    uStack_3a0 = CONCAT44(local_294,local_294);
    local_2c8 = &local_398;
    local_2d8 = &local_368;
    in_stack_fffffffffffffe18 =
         (Vec3fa *)
         CONCAT44(-(uint)(local_294 == local_218._4_4_),-(uint)(local_294 == (undefined4)local_218))
    ;
    in_stack_fffffffffffffe20 =
         (Vec3fa *)CONCAT44(-(uint)(local_294 == local_320),-(uint)(local_294 == local_320));
    local_300 = &local_398;
    auVar2._8_8_ = in_stack_fffffffffffffe20;
    auVar2._0_8_ = in_stack_fffffffffffffe18;
    iVar5 = movmskps((int)local_300,auVar2);
    if (iVar5 != 0) {
      return false;
    }
    local_284 = local_358->v2;
    local_2e8 = &local_3c8;
    local_3c8 = CONCAT44(local_284,local_284);
    uStack_3c0 = CONCAT44(local_284,local_284);
    local_2e0 = &local_3b8;
    local_2f0 = &local_368;
    local_3b8 = CONCAT44(-(uint)(local_284 == local_218._4_4_),
                         -(uint)(local_284 == (undefined4)local_218));
    uStack_3b0 = CONCAT44(-(uint)(local_284 == local_320),-(uint)(local_284 == local_320));
    local_308 = &local_3b8;
    auVar1._8_8_ = uStack_3b0;
    auVar1._0_8_ = local_3b8;
    iVar5 = movmskps((int)local_308,auVar1);
    local_31c = local_320;
    local_2c0 = local_310;
    local_2a0 = local_2b8;
    local_290 = local_2d0;
    local_280 = local_2e8;
    in_stack_fffffffffffffdf8 = local_314;
    in_stack_fffffffffffffdfc = local_318;
    in_stack_fffffffffffffe00 = local_320;
    in_stack_fffffffffffffe04 = local_320;
    local_398 = in_stack_fffffffffffffe18;
    pVStack_390 = in_stack_fffffffffffffe20;
    local_378 = in_stack_fffffffffffffe08;
    pVStack_370 = in_stack_fffffffffffffe10;
    local_368 = local_218;
    uStack_360 = uStack_210;
    if (iVar5 != 0) {
      return false;
    }
  }
  local_278 = std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::operator[]
                        (&local_340->x_,(long)local_350->v0);
  local_270 = &local_3d8;
  local_3d8 = *(undefined8 *)&local_278->field_0;
  uStack_3d0 = *(undefined8 *)((long)&local_278->field_0 + 8);
  local_268 = std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::operator[]
                        (&local_340->x_,(long)local_350->v1);
  local_260 = &local_3e8;
  local_3e8 = *(undefined8 *)&local_268->field_0;
  uStack_3e0 = *(undefined8 *)((long)&local_268->field_0 + 8);
  local_258 = std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::operator[]
                        (&local_340->x_,(long)local_350->v2);
  local_250 = &local_3f8;
  local_3f8 = *(undefined8 *)&local_258->field_0;
  uStack_3f0 = *(undefined8 *)((long)&local_258->field_0 + 8);
  local_248 = std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::operator[]
                        (&local_348->x_,(long)local_358->v0);
  local_240 = &local_408;
  local_408 = *(undefined8 *)&local_248->field_0;
  uStack_400 = *(undefined8 *)((long)&local_248->field_0 + 8);
  local_238 = std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::operator[]
                        (&local_348->x_,(long)local_358->v1);
  local_230 = &local_418;
  local_418 = *(undefined8 *)&local_238->field_0;
  uStack_410 = *(undefined8 *)((long)&local_238->field_0 + 8);
  local_228 = std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::operator[]
                        (&local_348->x_,(long)local_358->v2);
  local_428 = *(undefined8 *)&local_228->field_0;
  local_220 = (undefined1 *)&local_428;
  bVar4 = sse2::TriangleTriangleIntersector::intersect_triangle_triangle
                    (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                     in_stack_fffffffffffffe08,
                     (Vec3fa *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     (Vec3fa *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  return bVar4;
}

Assistant:

bool intersect_triangle_triangle (unsigned geomID0, unsigned primID0, unsigned geomID1, unsigned primID1)
{
  //CSTAT(bvh_collide_prim_intersections1++);
  
  /* special culling for scene intersection with itself */
  if (geomID0 == geomID1 && primID0 == primID1) {
    return false;
  }
  //CSTAT(bvh_collide_prim_intersections2++);

  auto mesh0 = meshes[geomID0].get ();
  auto mesh1 = meshes[geomID1].get ();
  auto const & tri0 = (Triangle&) mesh0->tris_[primID0];
  auto const & tri1 = (Triangle&) mesh1->tris_[primID1];
  
  if (geomID0 == geomID1)
  {
    /* ignore intersection with topological neighbors */
    const vint4 t0(tri0.v0,tri0.v1,tri0.v2,tri0.v2);
    if (any(vint4(tri1.v0) == t0)) return false;
    if (any(vint4(tri1.v1) == t0)) return false;
    if (any(vint4(tri1.v2) == t0)) return false;
  }
  //CSTAT(bvh_collide_prim_intersections3++);
  
  const Vec3fa a0 = mesh0->x_[tri0.v0];
  const Vec3fa a1 = mesh0->x_[tri0.v1];
  const Vec3fa a2 = mesh0->x_[tri0.v2];
  const Vec3fa b0 = mesh1->x_[tri1.v0];
  const Vec3fa b1 = mesh1->x_[tri1.v1];
  const Vec3fa b2 = mesh1->x_[tri1.v2];
  
  return isa::TriangleTriangleIntersector::intersect_triangle_triangle(a0,a1,a2,b0,b1,b2);
}